

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int isAttributeNext(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  int i;
  xmlParserCtxtPtr ctxt_local;
  
  iVar1 = xmlIsNameStartChar(ctxt,(uint)*ctxt->input->cur);
  if (iVar1 == 0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    local_1c = 1;
    while (iVar1 = xmlIsNameChar(ctxt,(uint)ctxt->input->cur[local_1c]), iVar1 != 0) {
      local_1c = local_1c + 1;
    }
    while( true ) {
      bVar2 = true;
      if ((((ctxt->input->cur[local_1c] != ' ') &&
           (((ctxt->input->cur[local_1c] < 9 || (bVar2 = true, 10 < ctxt->input->cur[local_1c])) &&
            (bVar2 = true, ctxt->input->cur[local_1c] != '\r')))) &&
          (bVar2 = false, ctxt->input->cur[local_1c] == '\\')) &&
         (((ctxt->input->cur[local_1c] == ' ' ||
           ((8 < ctxt->input->cur[local_1c] && (ctxt->input->cur[local_1c] < 0xb)))) ||
          (bVar2 = false, ctxt->input->cur[local_1c] == '\r')))) {
        local_1c = local_1c + 1;
        bVar2 = local_1c != 0;
      }
      if (!bVar2) break;
      local_1c = local_1c + 1;
    }
    ctxt_local._4_4_ = (uint)(ctxt->input->cur[local_1c] == '=');
  }
  return ctxt_local._4_4_;
}

Assistant:

static int isAttributeNext(xmlParserCtxtPtr ctxt) {
    int i;
    if (!xmlIsNameStartChar(ctxt, RAW)) return 0;
    for (i=1; xmlIsNameChar(ctxt, NXT(i)); i++) ;
    /* TODO FOR SML: Handle the case where i grows beyond INPUT_CHUNK */
    while (   IS_BLANK_CH(NXT(i))
    	   || ((NXT(i) == '\\') && IS_BLANK_CH(NXT(i)) && (++i != 0))) i++;
    return (NXT(i) == '=');
}